

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

SignatureData *
script_tests::CombineSignatures
          (SignatureData *__return_storage_ptr__,CTxOut *txout,CMutableTransaction *tx,
          SignatureData *scriptSig1,SignatureData *scriptSig2)

{
  long in_FS_OFFSET;
  MutableTransactionSignatureCreator local_7a0;
  SignatureData local_750;
  SignatureData local_3c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureData::SignatureData(__return_storage_ptr__);
  SignatureData::SignatureData(&local_3c0,scriptSig1);
  SignatureData::MergeSignatureData(__return_storage_ptr__,&local_3c0);
  SignatureData::~SignatureData(&local_3c0);
  SignatureData::SignatureData(&local_750,scriptSig2);
  SignatureData::MergeSignatureData(__return_storage_ptr__,&local_750);
  SignatureData::~SignatureData(&local_750);
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            (&local_7a0,tx,0,&txout->nValue,0);
  ProduceSignature(DUMMY_SIGNING_PROVIDER,&local_7a0.super_BaseSignatureCreator,&txout->scriptPubKey
                   ,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

SignatureData CombineSignatures(const CTxOut& txout, const CMutableTransaction& tx, const SignatureData& scriptSig1, const SignatureData& scriptSig2)
{
    SignatureData data;
    data.MergeSignatureData(scriptSig1);
    data.MergeSignatureData(scriptSig2);
    ProduceSignature(DUMMY_SIGNING_PROVIDER, MutableTransactionSignatureCreator(tx, 0, txout.nValue, SIGHASH_DEFAULT), txout.scriptPubKey, data);
    return data;
}